

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O1

LispPTR N_OP_cdr(LispPTR tos)

{
  uint uVar1;
  LispPTR LVar2;
  uint uVar3;
  
  LVar2 = 0;
  if (tos != 0) {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tos);
      }
      uVar3 = *(uint *)(Lisp_world + tos);
      uVar1 = uVar3 >> 0x1c;
      LVar2 = 0;
      if (uVar1 != 8) {
        if (uVar3 < 0x90000000) {
          if (uVar3 < 0x10000000) {
            LVar2 = cdr(uVar3);
            return LVar2;
          }
          uVar3 = tos + uVar1 * 2;
          if ((tos & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
          }
          LVar2 = *(uint *)(Lisp_world + uVar3) & 0xfffffff;
        }
        else {
          LVar2 = tos + (uVar1 & 7) * 2;
        }
      }
    }
    else {
      MachineState.errorexit = 1;
      LVar2 = 0xffffffff;
      MachineState.tosvalue = tos;
    }
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_cdr(LispPTR tos) {
  ConsCell *datum68k;
  DLword cdr_code;

  if (tos == NIL_PTR) return (tos);
  if (!Listp(tos)) {
      ERROR_EXIT(tos);
  }

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(tos));
  cdr_code = datum68k->cdr_code;

    if (cdr_code == CDR_NIL) return (NIL_PTR); /* cdr-nil */
    if (cdr_code > CDR_ONPAGE) /* cdr-samepage */
#ifdef NEWCDRCODING
      return (tos + ((cdr_code & 7) << 1));
#else
      return (POINTER_PAGEBASE(tos) + ((cdr_code & 127) << 1));
#endif                                 /*NEWCDRCODING */
    if (cdr_code == CDR_INDIRECT) /* cdr-indirect */
      return (cdr((LispPTR)(datum68k->car_field)));
    /* cdr-differentpage */
#ifdef NEWCDRCODING
    return ((LispPTR)((ConsCell *)(NativeAligned4FromLAddr(tos + (cdr_code << 1))))->car_field);
#else
    return ((LispPTR)((ConsCell *)(NativeAligned4FromLAddr(POINTER_PAGEBASE(tos) + (cdr_code << 1))))->car_field);
#endif /*NEWCDRCODING */
}